

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  uint uVar1;
  utf8proc_ssize_t uVar2;
  utf8proc_ssize_t uVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = utf8proc_normalize_utf32(buffer,length,options);
  if (uVar2 < 0) {
    return uVar2;
  }
  if ((options >> 0xb & 1) == 0) {
    if (uVar2 != 0) {
      lVar7 = 0;
      lVar6 = 0;
      do {
        uVar3 = utf8proc_encode_char(buffer[lVar6],(utf8proc_uint8_t *)((long)buffer + lVar7));
        lVar7 = lVar7 + uVar3;
        lVar6 = lVar6 + 1;
      } while (uVar2 != lVar6);
      goto LAB_00136308;
    }
  }
  else if (uVar2 != 0) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      uVar1 = buffer[lVar6];
      if ((int)uVar1 < 0) {
LAB_001362f2:
        lVar5 = 0;
      }
      else {
        bVar4 = (byte)uVar1;
        if ((int)uVar1 < 0x80) {
          *(byte *)((long)buffer + lVar7) = bVar4;
        }
        else {
          if ((int)uVar1 < 0x800) {
            *(char *)((long)buffer + lVar7) = (char)(uVar1 >> 6) + -0x40;
            *(byte *)((long)buffer + lVar7 + 1) = bVar4 & 0x3f | 0x80;
            lVar5 = 2;
            goto LAB_001362f4;
          }
          if (uVar1 == 0xfffe) {
            *(undefined1 *)((long)buffer + lVar7) = 0xfe;
          }
          else {
            if (uVar1 != 0xffff) {
              if ((int)uVar1 < 0x10000) {
                *(char *)((long)buffer + lVar7) = (char)(uVar1 >> 0xc) + -0x20;
                *(byte *)((long)buffer + lVar7 + 1) = (byte)(uVar1 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar7 + 2) = bVar4 & 0x3f | 0x80;
                lVar5 = 3;
              }
              else {
                if (0x10ffff < (int)uVar1) goto LAB_001362f2;
                *(char *)((long)buffer + lVar7) = (char)(uVar1 >> 0x12) + -0x10;
                *(byte *)((long)buffer + lVar7 + 1) = (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar7 + 2) = (byte)(uVar1 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar7 + 3) = bVar4 & 0x3f | 0x80;
                lVar5 = 4;
              }
              goto LAB_001362f4;
            }
            *(undefined1 *)((long)buffer + lVar7) = 0xff;
          }
        }
        lVar5 = 1;
      }
LAB_001362f4:
      lVar7 = lVar7 + lVar5;
      lVar6 = lVar6 + 1;
    } while (uVar2 != lVar6);
    goto LAB_00136308;
  }
  lVar7 = 0;
LAB_00136308:
  *(undefined1 *)((long)buffer + lVar7) = 0;
  return lVar7;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  length = utf8proc_normalize_utf32(buffer, length, options);
  if (length < 0) return length;
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}